

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall QFileDialog::setProxyModel(QFileDialog *this,QAbstractProxyModel *proxyModel)

{
  bool bVar1;
  QFileDialogPrivate *pQVar2;
  Ui_QFileDialog *pUVar3;
  QItemSelectionModel *pQVar4;
  QObject *in_RSI;
  QCompleter *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionModel *selections;
  QFileDialogPrivate *d;
  QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_> selModel;
  QModelIndex idx;
  Object *in_stack_fffffffffffffeb0;
  QAbstractItemView *this_00;
  QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_> *this_01;
  Object *in_stack_fffffffffffffeb8;
  QFileDialogPrivate *in_stack_fffffffffffffec0;
  QFileDialogTreeView *index;
  QFileDialogPrivate *in_stack_fffffffffffffec8;
  Connection *this_02;
  Function in_stack_fffffffffffffee0;
  offset_in_QAbstractItemModel_to_subr in_stack_fffffffffffffef0;
  undefined8 in_stack_ffffffffffffff00;
  ConnectionType type;
  Object *in_stack_ffffffffffffff08;
  code *in_stack_ffffffffffffff10;
  code *in_stack_ffffffffffffff30;
  code *in_stack_ffffffffffffff40;
  Connection local_78;
  code *local_70;
  undefined8 uStack_68;
  Connection local_60;
  QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_> local_58;
  code *local_50;
  undefined8 local_48;
  Connection local_40;
  code *local_38;
  undefined8 local_30;
  Connection local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  type = (ConnectionType)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QFileDialog *)0x760c8e);
  bVar1 = QFileDialogPrivate::usingWidgets(in_stack_fffffffffffffeb0);
  if ((bVar1) &&
     (((in_RSI != (QObject *)0x0 || (pQVar2->proxyModel != (QAbstractProxyModel *)0x0)) &&
      (in_RSI != (QObject *)pQVar2->proxyModel)))) {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QFileDialogPrivate::rootIndex(in_stack_fffffffffffffec0);
    if (pQVar2->proxyModel == (QAbstractProxyModel *)0x0) {
      in_stack_ffffffffffffff30 = QAbstractItemModel::rowsInserted;
      QObjectPrivate::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffee0);
    }
    else {
      in_stack_ffffffffffffff40 = QFileDialogPrivate::rowsInserted;
      QObjectPrivate::
      disconnect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
                (in_stack_fffffffffffffeb8,in_stack_fffffffffffffef0,in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffee0);
    }
    if (in_RSI == (QObject *)0x0) {
      pQVar2->proxyModel = (QAbstractProxyModel *)0x0;
      pUVar3 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                         (&pQVar2->qFileDialogUi);
      (**(code **)(*(long *)&(pUVar3->listView->super_QListView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pUVar3->listView,pQVar2->model);
      pUVar3 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                         (&pQVar2->qFileDialogUi);
      (**(code **)(*(long *)&(pUVar3->treeView->super_QTreeView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pUVar3->treeView,pQVar2->model);
      QCompleter::setModel(in_RDI,(QAbstractItemModel *)in_stack_fffffffffffffec8);
      pQVar2->completer->sourceModel = pQVar2->model;
      pQVar2->completer->proxyModel = (QAbstractProxyModel *)0x0;
      type = AutoConnection;
      in_stack_ffffffffffffff08 = (Object *)0x0;
      local_50 = QFileDialogPrivate::rowsInserted;
      local_48 = 0;
      this_00 = (QAbstractItemView *)0x0;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
                ((Object *)in_stack_ffffffffffffff10,
                 (offset_in_QAbstractItemModel_to_subr)in_stack_ffffffffffffff40,(Object *)0x0,
                 (Function)in_stack_ffffffffffffff30,AutoConnection);
      QMetaObject::Connection::~Connection(&local_40);
    }
    else {
      QObject::setParent(in_RSI);
      pQVar2->proxyModel = (QAbstractProxyModel *)in_RSI;
      (**(code **)(*(long *)in_RSI + 0x188))(in_RSI,pQVar2->model);
      pUVar3 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                         (&pQVar2->qFileDialogUi);
      (**(code **)(*(long *)&(pUVar3->listView->super_QListView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pUVar3->listView,pQVar2->proxyModel);
      pUVar3 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                         (&pQVar2->qFileDialogUi);
      (**(code **)(*(long *)&(pUVar3->treeView->super_QTreeView).super_QAbstractItemView.
                             super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
                (pUVar3->treeView,pQVar2->proxyModel);
      QCompleter::setModel(in_RDI,(QAbstractItemModel *)in_stack_fffffffffffffec8);
      pQVar2->completer->proxyModel = pQVar2->proxyModel;
      in_stack_ffffffffffffff10 = QAbstractItemModel::rowsInserted;
      local_38 = QFileDialogPrivate::rowsInserted;
      local_30 = 0;
      this_00 = (QAbstractItemView *)0x0;
      QObjectPrivate::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QFileDialogPrivate::*)(QModelIndex_const&)>
                ((Object *)QAbstractItemModel::rowsInserted,
                 (offset_in_QAbstractItemModel_to_subr)in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff08,(Function)in_stack_ffffffffffffff30,type);
      QMetaObject::Connection::~Connection(&local_28);
    }
    local_58.d = (QItemSelectionModel *)&DAT_aaaaaaaaaaaaaaaa;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&pQVar2->qFileDialogUi);
    pQVar4 = QAbstractItemView::selectionModel(this_00);
    QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_>::QScopedPointer
              (&local_58,pQVar4);
    pUVar3 = QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
                       (&pQVar2->qFileDialogUi);
    index = pUVar3->treeView;
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&pQVar2->qFileDialogUi);
    pQVar4 = QAbstractItemView::selectionModel(this_00);
    (**(code **)(*(long *)&(index->super_QTreeView).super_QAbstractItemView.
                           super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1d0))
              (index,pQVar4);
    QFileDialogPrivate::setRootIndex(in_stack_fffffffffffffec8,(QModelIndex *)index);
    QScopedPointer<Ui_QFileDialog,_QScopedPointerDeleter<Ui_QFileDialog>_>::operator->
              (&pQVar2->qFileDialogUi);
    QAbstractItemView::selectionModel(this_00);
    local_70 = QFileDialogPrivate::selectionChanged;
    uStack_68 = 0;
    this_02 = &local_60;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QItemSelection_const&,QItemSelection_const&),void(QFileDialogPrivate::*)()>
              ((Object *)in_stack_ffffffffffffff10,
               (offset_in_QItemSelectionModel_to_subr)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff08,(Function)in_stack_ffffffffffffff30,type);
    QMetaObject::Connection::~Connection(this_02);
    this_01 = (QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_> *)
              0x0;
    QObjectPrivate::
    connect<void(QItemSelectionModel::*)(QModelIndex_const&,QModelIndex_const&),void(QFileDialogPrivate::*)(QModelIndex_const&)>
              ((Object *)in_stack_ffffffffffffff10,
               (offset_in_QItemSelectionModel_to_subr)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff08,(Function)in_stack_ffffffffffffff30,type);
    QMetaObject::Connection::~Connection(&local_78);
    QScopedPointer<QItemSelectionModel,_QScopedPointerDeleter<QItemSelectionModel>_>::
    ~QScopedPointer(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialog::setProxyModel(QAbstractProxyModel *proxyModel)
{
    Q_D(QFileDialog);
    if (!d->usingWidgets())
        return;
    if ((!proxyModel && !d->proxyModel)
        || (proxyModel == d->proxyModel))
        return;

    QModelIndex idx = d->rootIndex();
    if (d->proxyModel)
        QObjectPrivate::disconnect(d->proxyModel, &QAbstractProxyModel::rowsInserted,
                                   d, &QFileDialogPrivate::rowsInserted);
    else
        QObjectPrivate::disconnect(d->model, &QAbstractItemModel::rowsInserted,
                                   d, &QFileDialogPrivate::rowsInserted);

    if (proxyModel != nullptr) {
        proxyModel->setParent(this);
        d->proxyModel = proxyModel;
        proxyModel->setSourceModel(d->model);
        d->qFileDialogUi->listView->setModel(d->proxyModel);
        d->qFileDialogUi->treeView->setModel(d->proxyModel);
#if QT_CONFIG(fscompleter)
        d->completer->setModel(d->proxyModel);
        d->completer->proxyModel = d->proxyModel;
#endif
        QObjectPrivate::connect(d->proxyModel, &QAbstractItemModel::rowsInserted,
                                d, &QFileDialogPrivate::rowsInserted);
    } else {
        d->proxyModel = nullptr;
        d->qFileDialogUi->listView->setModel(d->model);
        d->qFileDialogUi->treeView->setModel(d->model);
#if QT_CONFIG(fscompleter)
        d->completer->setModel(d->model);
        d->completer->sourceModel = d->model;
        d->completer->proxyModel = nullptr;
#endif
        QObjectPrivate::connect(d->model, &QAbstractItemModel::rowsInserted,
                                d, &QFileDialogPrivate::rowsInserted);
    }
    QScopedPointer<QItemSelectionModel> selModel(d->qFileDialogUi->treeView->selectionModel());
    d->qFileDialogUi->treeView->setSelectionModel(d->qFileDialogUi->listView->selectionModel());

    d->setRootIndex(idx);

    // reconnect selection
    QItemSelectionModel *selections = d->qFileDialogUi->listView->selectionModel();
    QObjectPrivate::connect(selections, &QItemSelectionModel::selectionChanged,
                            d, &QFileDialogPrivate::selectionChanged);
    QObjectPrivate::connect(selections, &QItemSelectionModel::currentChanged,
                            d, &QFileDialogPrivate::currentChanged);
}